

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestViewSampling::initIterationSpecificProgramObject
          (TextureViewTestViewSampling *this)

{
  ostringstream *this_00;
  GLenum GVar1;
  TextureViewTestViewSampling *pTVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLint GVar6;
  undefined4 extraout_var;
  ulong uVar8;
  size_t sVar9;
  MessageBuilder *this_01;
  TestError *pTVar10;
  char *pcVar11;
  GLuint *pGVar12;
  long lVar13;
  string sampler_declarations_string;
  string sample_fetch_string;
  GLint compile_status;
  string fs_string;
  string gs_string;
  string te_string;
  string tc_string;
  string vs_string;
  char *vs_body_raw_ptr;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  char *gs_body_raw_ptr;
  string sample_fetch_fs_string;
  char *fs_body_raw_ptr;
  GLchar *shader_sources [5];
  GLuint so_ids [5];
  char *varying_names [4];
  stringstream n_samples_sstream;
  GLint link_status;
  undefined1 *local_8c0;
  char *local_8b8;
  undefined1 local_8b0;
  undefined7 uStack_8af;
  TextureViewTestViewSampling *local_8a0;
  undefined1 *local_898;
  char *local_890;
  undefined1 local_888;
  undefined7 uStack_887;
  int local_874;
  long *local_870 [2];
  long local_860 [2];
  long *local_850 [2];
  long local_840 [2];
  long *local_830 [2];
  long local_820 [2];
  long *local_810 [2];
  long local_800 [2];
  long *local_7f0 [2];
  long local_7e0 [2];
  long *local_7d0;
  long *local_7c8;
  long *local_7c0;
  long *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  undefined1 local_7a0;
  undefined7 uStack_79f;
  long *local_790;
  long *local_788 [4];
  long *local_768;
  GLuint local_758 [4];
  GLuint local_748;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  char *local_728;
  char *pcStack_720;
  stringstream local_338 [16];
  undefined1 local_328 [112];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  deinitIterationSpecificProgramAndShaderObjects(this);
  GVar4 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(lVar7 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar4;
  GVar4 = (**(code **)(lVar7 + 0x3f0))(0x8e88);
  this->m_tc_id = GVar4;
  GVar4 = (**(code **)(lVar7 + 0x3f0))(0x8e87);
  this->m_te_id = GVar4;
  GVar4 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x12fd);
  GVar4 = (**(code **)(lVar7 + 0x3c8))();
  this->m_po_id = GVar4;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateProgram() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1300);
  std::__cxx11::stringstream::stringstream(local_338);
  local_8c0 = &local_8b0;
  local_8b8 = (char *)0x0;
  local_8b0 = 0;
  local_898 = &local_888;
  local_890 = (char *)0x0;
  local_888 = 0;
  local_7b0 = &local_7a0;
  local_7a8 = (char *)0x0;
  local_7a0 = 0;
  local_8a0 = this;
  std::ostream::_M_insert<unsigned_long>((ulong)local_328);
  GVar1 = local_8a0->m_iteration_view_texture_target;
  if ((int)GVar1 < 0x8c18) {
    if ((int)GVar1 < 0x806f) {
      if (GVar1 == 0xde0) {
        std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,0x1ae1495);
        std::__cxx11::string::_M_replace((ulong)&local_898,0,local_890,0x1ae14b0);
        pcVar11 = "vec4 current_sample = textureLod(texture, gs_fs_uv.x, lod);\n";
      }
      else {
        if (GVar1 != 0xde1) {
LAB_00a355c0:
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,"Unrecognized texture target",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x13d7);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,0x1ae15fc);
        std::__cxx11::string::_M_replace((ulong)&local_898,0,local_890,0x1ae1617);
        pcVar11 = "vec4 current_sample = textureLod(texture, gs_fs_uv, lod);\n";
      }
      goto LAB_00a34861;
    }
    if (GVar1 != 0x806f) {
      if (GVar1 == 0x84f5) {
        std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,0x1ae259a);
        std::__cxx11::string::_M_replace((ulong)&local_898,0,local_890,0x1ae25b9);
        pcVar11 = 
        "ivec2 texture_size   = textureSize(texture);\nvec4  current_sample = texelFetch (texture, ivec2(gs_fs_uv.xy * vec2(texture_size)));\n"
        ;
      }
      else {
        if (GVar1 != 0x8513) goto LAB_00a355c0;
        std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,0x1ae1b4b);
        std::__cxx11::string::_M_replace((ulong)&local_898,0,local_890,0x1ae1b84);
        pcVar11 = 
        "vec4 current_sample;\n\nswitch (n_face)\n{\n    case 0: current_sample = textureLod(texture, normalize(vec3( 1, gs_fs_uv.xy)), lod); break;\n    case 1: current_sample = textureLod(texture, normalize(vec3(-1, gs_fs_uv.xy)), lod); break;\n    case 2: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.x, 1,  gs_fs_uv.y)), lod); break;\n    case 3: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.x, -1, gs_fs_uv.y)), lod); break;\n    case 4: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.xy,  1)), lod); break;\n    case 5: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.xy, -1)), lod); break;\n}\n"
        ;
      }
      goto LAB_00a34861;
    }
    pcVar11 = "uniform sampler3D texture;uniform float     z_float;";
  }
  else {
    if (0x9008 < (int)GVar1) {
      if (GVar1 == 0x9009) {
        std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,0x1ae2014);
        std::__cxx11::string::_M_replace((ulong)&local_898,0,local_890,0x1ae207a);
        pcVar11 = 
        "vec4 current_sample;\n\nswitch (n_face)\n{\n    case 0: current_sample = textureLod(texture, vec4(normalize(vec3( 1, gs_fs_uv.xy)), z_float), lod); break;\n    case 1: current_sample = textureLod(texture, vec4(normalize(vec3(-1, gs_fs_uv.xy)), z_float), lod); break;\n    case 2: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.x, 1,  gs_fs_uv.y)), z_float), lod); break;\n    case 3: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.x, -1,  gs_fs_uv.y)), z_float), lod); break;\n    case 4: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.xy, 1)), z_float), lod); break;\n    case 5: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.xy, -1)), z_float), lod); break;\n}\n"
        ;
      }
      else if (GVar1 == 0x9100) {
        std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,0x1ae1763);
        std::__cxx11::string::_M_replace((ulong)&local_898,0,local_890,0x1ae1780);
        pcVar11 = 
        "ivec2 texture_size   = textureSize(texture);\nvec4  current_sample = texelFetch (texture,\n                                   ivec2(gs_fs_uv * vec2(texture_size)),\n                                   n_sample);\n"
        ;
      }
      else {
        if (GVar1 != 0x9102) goto LAB_00a355c0;
        std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,0x1ae191f);
        std::__cxx11::string::_M_replace((ulong)&local_898,0,local_890,0x1ae1961);
        pcVar11 = 
        "ivec3 texture_size = textureSize(texture);\nvec4  current_sample = texelFetch (texture,\n                                   ivec3(ivec2(gs_fs_uv * vec2(texture_size).xy), z_int),\n                                   n_sample);\n"
        ;
      }
      goto LAB_00a34861;
    }
    if (GVar1 == 0x8c18) {
      std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,0x1ae152a);
      std::__cxx11::string::_M_replace((ulong)&local_898,0,local_890,0x1ae156b);
      pcVar11 = "vec4 current_sample = textureLod(texture, vec2(gs_fs_uv.x, z_float), lod);\n";
      goto LAB_00a34861;
    }
    if (GVar1 != 0x8c1a) goto LAB_00a355c0;
    pcVar11 = "uniform float          z_float;\nuniform sampler2DArray texture;";
  }
  std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,(ulong)pcVar11);
  std::__cxx11::string::_M_replace((ulong)&local_898,0,local_890,0x1ae16ce);
  pcVar11 = "vec4 current_sample = textureLod(texture, vec3(gs_fs_uv, z_float), lod);\n";
LAB_00a34861:
  std::__cxx11::string::_M_replace((ulong)&local_7b0,0,local_7a8,(ulong)pcVar11);
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7f0,
             "#version 400\n\nuniform float lod;\nuniform vec4 reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nout int vs_tc_vs_sampling_result;\n\nvoid main()\n{\n    const float epsilon = 1.0 / 255.0;\n\n    vs_tc_vs_sampling_result = 1;\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH;\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            vs_tc_vs_sampling_result = int(current_sample.x * 256.0);\n\n            break;\n        }\n    }\n\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n}\n"
             ,"");
  uVar8 = std::__cxx11::string::find((char *)local_7f0,0x1ae1469,0);
  if (uVar8 != 0xffffffffffffffff) {
    do {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace
                ((ulong)local_7f0,uVar8,(char *)0x9,CONCAT44(uStack_734,local_738));
      if ((char **)CONCAT44(uStack_734,local_738) != &local_728) {
        operator_delete((char **)CONCAT44(uStack_734,local_738),(ulong)(local_728 + 1));
      }
      uVar8 = std::__cxx11::string::find((char *)local_7f0,0x1ae1469,0);
    } while (uVar8 != 0xffffffffffffffff);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_7f0,0x1ae1473,0),
        uVar8 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_7f0,uVar8,(char *)0x14,(ulong)local_8c0);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_7f0,0x1ae1488,0),
        uVar8 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_7f0,uVar8,(char *)0xc,(ulong)local_898);
  }
  local_810[0] = local_800;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_810,
             "#version 400\n\nlayout(vertices = 1) out;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nin  int vs_tc_vs_sampling_result[];\nout int tc_te_vs_sampling_result[];\nout int tc_te_tc_sampling_result[];\n\nvoid main()\n{\n    const float epsilon = 1.0 / 255.0;\n\n    tc_te_vs_sampling_result[gl_InvocationID] = vs_tc_vs_sampling_result[gl_InvocationID];\n    tc_te_tc_sampling_result[gl_InvocationID] = 1;\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            tc_te_tc_sampling_result[gl_InvocationID] = 0;\n\n            break;\n        }\n    }\n\n   gl_TessLevelInner[0] = 1.0;\n   gl_TessLevelInner[1] = 1.0;\n   gl_TessLevelOuter[0] = 1.0;\n   gl_TessLevelOuter[1] = 1.0;\n   gl_TessLevelOuter[2] = 1.0;\n   gl_TessLevelOuter[3] = 1.0;\n}\n"
             ,"");
  uVar8 = std::__cxx11::string::find((char *)local_810,0x1ae1469,0);
  if (uVar8 != 0xffffffffffffffff) {
    do {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace
                ((ulong)local_810,uVar8,(char *)0x9,CONCAT44(uStack_734,local_738));
      if ((char **)CONCAT44(uStack_734,local_738) != &local_728) {
        operator_delete((char **)CONCAT44(uStack_734,local_738),(ulong)(local_728 + 1));
      }
      uVar8 = std::__cxx11::string::find((char *)local_810,0x1ae1469,0);
    } while (uVar8 != 0xffffffffffffffff);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_810,0x1ae1473,0),
        uVar8 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_810,uVar8,(char *)0x14,(ulong)local_8c0);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_810,0x1ae1488,0),
        uVar8 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_810,uVar8,(char *)0xc,(ulong)local_898);
  }
  local_830[0] = local_820;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_830,
             "#version 400\n\nlayout(quads) in;\n\nin  int  tc_te_vs_sampling_result[];\nin  int  tc_te_tc_sampling_result[];\nout int  te_gs_vs_sampling_result;\nout int  te_gs_tc_sampling_result;\nout int  te_gs_te_sampling_result;\nout vec2 te_gs_uv;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nvoid main()\n{\n    te_gs_vs_sampling_result = tc_te_vs_sampling_result[0];\n    te_gs_tc_sampling_result = tc_te_tc_sampling_result[0];\n    te_gs_te_sampling_result = 1;\n\n    gl_Position.xy = gl_TessCoord.xy * 2.0 - 1.0;\n    gl_Position.zw = vec2(0, 1);\n    te_gs_uv       = vec2(gl_TessCoord.x, 1.0 - gl_TessCoord.y);\n\n\n    const float epsilon = 1.0 / 255.0;\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            te_gs_te_sampling_result = 0;\n\n            break;\n        }\n    }\n\n}\n"
             ,"");
  uVar8 = std::__cxx11::string::find((char *)local_830,0x1ae1469,0);
  if (uVar8 != 0xffffffffffffffff) {
    do {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace
                ((ulong)local_830,uVar8,(char *)0x9,CONCAT44(uStack_734,local_738));
      if ((char **)CONCAT44(uStack_734,local_738) != &local_728) {
        operator_delete((char **)CONCAT44(uStack_734,local_738),(ulong)(local_728 + 1));
      }
      uVar8 = std::__cxx11::string::find((char *)local_830,0x1ae1469,0);
    } while (uVar8 != 0xffffffffffffffff);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_830,0x1ae1473,0),
        uVar8 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_830,uVar8,(char *)0x14,(ulong)local_8c0);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_830,0x1ae1488,0),
        uVar8 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_830,uVar8,(char *)0xc,(ulong)local_898);
  }
  local_850[0] = local_840;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_850,
             "#version 400\n\nlayout (triangles)                        in;\nlayout (triangle_strip, max_vertices = 3) out;\n\nin  int  te_gs_vs_sampling_result[];\nin  int  te_gs_tc_sampling_result[];\nin  int  te_gs_te_sampling_result[];\nin  vec2 te_gs_uv                [];\nout int  gs_fs_vs_sampling_result;\nout int  gs_fs_tc_sampling_result;\nout int  gs_fs_te_sampling_result;\nout int  gs_fs_gs_sampling_result;\nout vec2 gs_fs_uv;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nvoid main()\n{\n    const float epsilon            = 1.0 / 255.0;\n    int         gs_sampling_result = 1;\n    int         tc_sampling_result = te_gs_tc_sampling_result[0] & te_gs_tc_sampling_result[1] & te_gs_tc_sampling_result[2];\n    int         te_sampling_result = te_gs_te_sampling_result[0] & te_gs_te_sampling_result[1] & te_gs_te_sampling_result[2];\n    int         vs_sampling_result = te_gs_vs_sampling_result[0] & te_gs_vs_sampling_result[1] & te_gs_vs_sampling_result[2];\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH;\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            gs_sampling_result = 0;\n\n            break;\n        }\n    }\n\n    gl_Position              = gl_in[0].gl_Position;\n    gs_fs_uv                 = te_gs_uv[0];\n    gs_fs_gs_sampling_result = gs_sampling_result;\n    gs_fs_tc_sampling_result = tc_sampling_result;\n    gs_fs_te_sampling_result = te_sampling_result;\n    gs_fs_vs_sampling_result = vs_sampling_result;\n    EmitVertex();\n\n    gl_Position              = gl_in[1].gl_Position;\n    gs_fs_uv                 = te_gs_uv[1];\n    gs_fs_gs_sampling_result = gs_sampling_result;\n    gs_fs_tc_sampling_result = tc_sampling_result;\n    gs_fs_te_sampling_result = te_sampling_result;\n    gs_fs_vs..." /* TRUNCATED STRING LITERAL */
             ,"");
  uVar8 = std::__cxx11::string::find((char *)local_850,0x1ae1469,0);
  if (uVar8 != 0xffffffffffffffff) {
    do {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace
                ((ulong)local_850,uVar8,(char *)0x9,CONCAT44(uStack_734,local_738));
      if ((char **)CONCAT44(uStack_734,local_738) != &local_728) {
        operator_delete((char **)CONCAT44(uStack_734,local_738),(ulong)(local_728 + 1));
      }
      uVar8 = std::__cxx11::string::find((char *)local_850,0x1ae1469,0);
    } while (uVar8 != 0xffffffffffffffff);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_850,0x1ae1473,0),
        uVar8 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_850,uVar8,(char *)0x14,(ulong)local_8c0);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_850,0x1ae1488,0),
        uVar8 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_850,uVar8,(char *)0xc,(ulong)local_898);
  }
  local_870[0] = local_860;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_870,
             "#version 400\n\nin vec2 gs_fs_uv;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nout vec4 result;\n\nvoid main()\n{\n    const float epsilon = 1.0 / 255.0;\n\n    result = vec4(1.0);\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            result = vec4(0.0);\n\n            break;\n        }\n    }\n}\n"
             ,"");
  uVar8 = std::__cxx11::string::find((char *)local_870,0x1ae1469,0);
  if (uVar8 != 0xffffffffffffffff) {
    do {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace
                ((ulong)local_870,uVar8,(char *)0x9,CONCAT44(uStack_734,local_738));
      if ((char **)CONCAT44(uStack_734,local_738) != &local_728) {
        operator_delete((char **)CONCAT44(uStack_734,local_738),(ulong)(local_728 + 1));
      }
      uVar8 = std::__cxx11::string::find((char *)local_870,0x1ae1469,0);
    } while (uVar8 != 0xffffffffffffffff);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_870,0x1ae1473,0),
        uVar8 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_870,uVar8,(char *)0x14,(ulong)local_8c0);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_870,0x1ae1488,0), pTVar2 = local_8a0,
        uVar8 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_870,uVar8,(char *)0xc,(ulong)local_7b0);
  }
  local_790 = local_870[0];
  local_7b8 = local_850[0];
  local_7c0 = local_810[0];
  local_7c8 = local_830[0];
  local_7d0 = local_7f0[0];
  (**(code **)(lVar7 + 0x12b8))(local_8a0->m_fs_id,1,&local_790,0);
  (**(code **)(lVar7 + 0x12b8))(pTVar2->m_gs_id,1,&local_7b8,0);
  (**(code **)(lVar7 + 0x12b8))(pTVar2->m_tc_id,1,&local_7c0,0);
  (**(code **)(lVar7 + 0x12b8))(pTVar2->m_te_id,1,&local_7c8,0);
  (**(code **)(lVar7 + 0x12b8))(pTVar2->m_vs_id,1,&local_7d0,0);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glShaderSource() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1520);
  pGVar12 = local_758;
  local_758[0] = pTVar2->m_fs_id;
  local_758[1] = pTVar2->m_gs_id;
  local_758[2] = pTVar2->m_tc_id;
  local_758[3] = pTVar2->m_te_id;
  local_748 = pTVar2->m_vs_id;
  local_788[0] = local_790;
  local_788[1] = local_7b8;
  local_788[2] = local_7c0;
  local_788[3] = local_7c8;
  local_768 = local_7d0;
  lVar13 = 0;
  do {
    local_874 = 0;
    GVar4 = *pGVar12;
    (**(code **)(lVar7 + 0x248))(GVar4);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x152f);
    (**(code **)(lVar7 + 0xa70))(GVar4,0x8b81,&local_874);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1532);
    if (local_874 != 1) {
      (**(code **)(lVar7 + 0xa58))(GVar4,0x400,0,&local_738);
      local_1b0._0_8_ = ((local_8a0->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Shader compilation error log:\n",0x1e);
      sVar9 = strlen((char *)&local_738);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(char *)&local_738,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"\nShader source:\n",0x10);
      this_01 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(char **)((long)local_788 - lVar13));
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,"Shader compilation failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x153e);
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar7 + 0x10))(local_8a0->m_po_id,GVar4);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glAttachShader() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1543);
    pTVar2 = local_8a0;
    lVar13 = lVar13 + -8;
    pGVar12 = pGVar12 + 1;
  } while (lVar13 != -0x28);
  local_728 = "gs_fs_te_sampling_result";
  pcStack_720 = "gs_fs_gs_sampling_result";
  local_738 = 0x1ae3f0c;
  uStack_734 = 0;
  uStack_730 = 0x1ae3f25;
  uStack_72c = 0;
  (**(code **)(lVar7 + 0x14c8))(local_8a0->m_po_id,4,&local_738,0x8c8c);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glTransformFeedbackVaryings() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x154c);
  local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
  (**(code **)(lVar7 + 0xce8))(pTVar2->m_po_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1552);
  (**(code **)(lVar7 + 0x9d8))(pTVar2->m_po_id,0x8b82,local_1b0);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1555);
  if (local_1b0._0_4_ == 1) {
    GVar6 = (**(code **)(lVar7 + 0xb48))(pTVar2->m_po_id,"lod");
    pTVar2->m_po_lod_location = GVar6;
    GVar6 = (**(code **)(lVar7 + 0xb48))(pTVar2->m_po_id,"n_face");
    pTVar2->m_po_n_face_location = GVar6;
    GVar6 = (**(code **)(lVar7 + 0xb48))(pTVar2->m_po_id,"reference_colors");
    pTVar2->m_po_reference_colors_location = GVar6;
    GVar6 = (**(code **)(lVar7 + 0xb48))(pTVar2->m_po_id,"texture");
    pTVar2->m_po_texture_location = GVar6;
    GVar6 = (**(code **)(lVar7 + 0xb48))(pTVar2->m_po_id,"z_float");
    pTVar2->m_po_z_float_location = GVar6;
    GVar6 = (**(code **)(lVar7 + 0xb48))(pTVar2->m_po_id,"z_int");
    pTVar2->m_po_z_int_location = GVar6;
    if (pTVar2->m_po_reference_colors_location != -1) {
      if (local_870[0] != local_860) {
        operator_delete(local_870[0],local_860[0] + 1);
      }
      if (local_850[0] != local_840) {
        operator_delete(local_850[0],local_840[0] + 1);
      }
      if (local_830[0] != local_820) {
        operator_delete(local_830[0],local_820[0] + 1);
      }
      if (local_810[0] != local_800) {
        operator_delete(local_810[0],local_800[0] + 1);
      }
      if (local_7f0[0] != local_7e0) {
        operator_delete(local_7f0[0],local_7e0[0] + 1);
      }
      if (local_7b0 != &local_7a0) {
        operator_delete(local_7b0,CONCAT71(uStack_79f,local_7a0) + 1);
      }
      if (local_898 != &local_888) {
        operator_delete(local_898,CONCAT71(uStack_887,local_888) + 1);
      }
      if (local_8c0 != &local_8b0) {
        operator_delete(local_8c0,CONCAT71(uStack_8af,local_8b0) + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_338);
      std::ios_base::~ios_base(local_2b8);
      return;
    }
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"reference_colors is considered an inactive uniform which is invalid.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1568);
  }
  else {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Program linking failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1559);
  }
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureViewTestViewSampling::initIterationSpecificProgramObject()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release shader/program objects that may have been initialized in previous
	 * iterations.
	 */
	deinitIterationSpecificProgramAndShaderObjects();

	/* Create program and shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_tc_id = gl.createShader(GL_TESS_CONTROL_SHADER);
	m_te_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call(s) failed.");

	/* Prepare token replacement strings */
	std::stringstream n_samples_sstream;
	std::string		  sampler_declarations_string;
	std::string		  sample_fetch_string;
	std::string		  sample_fetch_fs_string;
	std::size_t		  token_location			 = std::string::npos;
	const char*		  token_n_samples			 = "N_SAMPLES";
	const char*		  token_sampler_declarations = "SAMPLER_DECLARATIONS";
	const char*		  token_sample_fetch		 = "SAMPLE_FETCH";

	n_samples_sstream << m_iteration_parent_texture_n_samples;

	switch (m_iteration_view_texture_target)
	{
	case GL_TEXTURE_1D:
	{
		sampler_declarations_string = "uniform sampler1D texture;";
		sample_fetch_string			= "vec4 current_sample = textureLod(texture, 0.5,        lod);\n";
		sample_fetch_fs_string		= "vec4 current_sample = textureLod(texture, gs_fs_uv.x, lod);\n";

		break;
	}

	case GL_TEXTURE_1D_ARRAY:
	{
		sampler_declarations_string = "uniform sampler1DArray texture;\n"
									  "uniform float          z_float;\n";

		sample_fetch_string	= "vec4 current_sample = textureLod(texture, vec2(0.5, z_float), lod);\n";
		sample_fetch_fs_string = "vec4 current_sample = textureLod(texture, vec2(gs_fs_uv.x, z_float), lod);\n";

		break;
	}

	case GL_TEXTURE_2D:
	{
		sampler_declarations_string = "uniform sampler2D texture;";
		sample_fetch_string			= "vec4 current_sample = textureLod(texture, vec2(0.5), lod);\n";
		sample_fetch_fs_string		= "vec4 current_sample = textureLod(texture, gs_fs_uv, lod);\n";

		break;
	}

	case GL_TEXTURE_2D_ARRAY:
	{
		sampler_declarations_string = "uniform float          z_float;\n"
									  "uniform sampler2DArray texture;";

		sample_fetch_string	= "vec4 current_sample = textureLod(texture, vec3(vec2(0.5), z_float), lod);\n";
		sample_fetch_fs_string = "vec4 current_sample = textureLod(texture, vec3(gs_fs_uv, z_float), lod);\n";

		break;
	}

	case GL_TEXTURE_2D_MULTISAMPLE:
	{
		sampler_declarations_string = "uniform sampler2DMS texture;";
		sample_fetch_string			= "ivec2 texture_size   = textureSize(texture);\n"
							  "vec4  current_sample = texelFetch (texture,\n"
							  "                                   ivec2(texture_size.xy / ivec2(2)),\n"
							  "                                   n_sample);\n";

		sample_fetch_fs_string = "ivec2 texture_size   = textureSize(texture);\n"
								 "vec4  current_sample = texelFetch (texture,\n"
								 "                                   ivec2(gs_fs_uv * vec2(texture_size)),\n"
								 "                                   n_sample);\n";

		break;
	}

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
	{
		sampler_declarations_string = "uniform sampler2DMSArray texture;"
									  "uniform int              z_int;\n";

		sample_fetch_string = "ivec3 texture_size   = textureSize(texture);\n"
							  "vec4  current_sample = texelFetch (texture,\n"
							  "                                   ivec3(texture_size.xy / ivec2(2), z_int),\n"
							  "                                   n_sample);\n";

		sample_fetch_fs_string =
			"ivec3 texture_size = textureSize(texture);\n"
			"vec4  current_sample = texelFetch (texture,\n"
			"                                   ivec3(ivec2(gs_fs_uv * vec2(texture_size).xy), z_int),\n"
			"                                   n_sample);\n";

		break;
	}

	case GL_TEXTURE_3D:
	{
		sampler_declarations_string = "uniform sampler3D texture;"
									  "uniform float     z_float;";

		sample_fetch_string	= "vec4 current_sample = textureLod(texture, vec3(vec2(0.5), z_float), lod);\n";
		sample_fetch_fs_string = "vec4 current_sample = textureLod(texture, vec3(gs_fs_uv, z_float), lod);\n";

		break;
	}

	case GL_TEXTURE_CUBE_MAP:
	{
		sampler_declarations_string = "uniform samplerCube texture;\n"
									  "uniform int         n_face;";

		sample_fetch_string = "vec4 current_sample;\n"
							  "\n"
							  "switch (n_face)\n"
							  "{\n"
							  // GL_TEXTURE_CUBE_MAP_POSITIVE_X
							  "    case 0: current_sample = textureLod(texture, vec3( 1,  0,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_NEGATIVE_X
							  "    case 1: current_sample = textureLod(texture, vec3(-1,  0,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_POSITIVE_Y
							  "    case 2: current_sample = textureLod(texture, vec3( 0,  1,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
							  "    case 3: current_sample = textureLod(texture, vec3( 0, -1,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_POSITIVE_Z
							  "    case 4: current_sample = textureLod(texture, vec3( 0,  0,  1), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
							  "    case 5: current_sample = textureLod(texture, vec3( 0,  0, -1), lod); break;\n"
							  "}\n";

		sample_fetch_fs_string =
			"vec4 current_sample;\n"
			"\n"
			"switch (n_face)\n"
			"{\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_X
			"    case 0: current_sample = textureLod(texture, normalize(vec3( 1, gs_fs_uv.xy)), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_X
			"    case 1: current_sample = textureLod(texture, normalize(vec3(-1, gs_fs_uv.xy)), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Y
			"    case 2: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.x, 1,  gs_fs_uv.y)), lod); "
			"break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
			"    case 3: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.x, -1, gs_fs_uv.y)), lod); "
			"break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Z
			"    case 4: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.xy,  1)), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
			"    case 5: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.xy, -1)), lod); break;\n"
			"}\n";
		break;
	}

	case GL_TEXTURE_CUBE_MAP_ARRAY:
	{
		sampler_declarations_string = "uniform samplerCubeArray texture;\n"
									  "uniform int              n_face;\n"
									  "uniform float            z_float;\n";

		sample_fetch_string =
			"vec4 current_sample;\n"
			"\n"
			"switch (n_face)\n"
			"{\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_X
			"    case 0: current_sample = textureLod(texture, vec4( 1,  0,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_X
			"    case 1: current_sample = textureLod(texture, vec4(-1,  0,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Y
			"    case 2: current_sample = textureLod(texture, vec4( 0,  1,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
			"    case 3: current_sample = textureLod(texture, vec4( 0, -1,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Z
			"    case 4: current_sample = textureLod(texture, vec4( 0,  0,  1, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
			"    case 5: current_sample = textureLod(texture, vec4( 0,  0, -1, z_float), lod); break;\n"
			"}\n";

		sample_fetch_fs_string = "vec4 current_sample;\n"
								 "\n"
								 "switch (n_face)\n"
								 "{\n"
								 // GL_TEXTURE_CUBE_MAP_POSITIVE_X
								 "    case 0: current_sample = textureLod(texture, vec4(normalize(vec3( 1, "
								 "gs_fs_uv.xy)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_NEGATIVE_X
								 "    case 1: current_sample = textureLod(texture, vec4(normalize(vec3(-1, "
								 "gs_fs_uv.xy)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_POSITIVE_Y
								 "    case 2: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.x, 1, "
								 " gs_fs_uv.y)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
								 "    case 3: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.x, "
								 "-1,  gs_fs_uv.y)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_POSITIVE_Z
								 "    case 4: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.xy, "
								 "1)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
								 "    case 5: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.xy, "
								 "-1)), z_float), lod); break;\n"
								 "}\n";

		break;
	}

	case GL_TEXTURE_RECTANGLE:
	{
		sampler_declarations_string = "uniform sampler2DRect texture;";
		sample_fetch_string			= "ivec2 texture_size   = textureSize(texture);\n"
							  "vec4  current_sample = texelFetch (texture, texture_size / ivec2(2));\n";

		sample_fetch_fs_string =
			"ivec2 texture_size   = textureSize(texture);\n"
			"vec4  current_sample = texelFetch (texture, ivec2(gs_fs_uv.xy * vec2(texture_size)));\n";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized texture target");
	}
	} /* switch (m_iteration_view_texture_target) */

	/* Set vertex shader's body */
	const char* vs_body = "#version 400\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4 reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "out int vs_tc_vs_sampling_result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    vs_tc_vs_sampling_result = 1;\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH;\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            vs_tc_vs_sampling_result = int(current_sample.x * 256.0);\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
						  "}\n";
	std::string vs_string = vs_body;

	while ((token_location = vs_string.find(token_n_samples)) != std::string::npos)
	{
		vs_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = vs_string.find(token_sampler_declarations)) != std::string::npos)
	{
		vs_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = vs_string.find(token_sample_fetch)) != std::string::npos)
	{
		vs_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set tessellation control shader's body */
	const char* tc_body = "#version 400\n"
						  "\n"
						  "layout(vertices = 1) out;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "in  int vs_tc_vs_sampling_result[];\n"
						  "out int tc_te_vs_sampling_result[];\n"
						  "out int tc_te_tc_sampling_result[];\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    tc_te_vs_sampling_result[gl_InvocationID] = vs_tc_vs_sampling_result[gl_InvocationID];\n"
						  "    tc_te_tc_sampling_result[gl_InvocationID] = 1;\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            tc_te_tc_sampling_result[gl_InvocationID] = 0;\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "   gl_TessLevelInner[0] = 1.0;\n"
						  "   gl_TessLevelInner[1] = 1.0;\n"
						  "   gl_TessLevelOuter[0] = 1.0;\n"
						  "   gl_TessLevelOuter[1] = 1.0;\n"
						  "   gl_TessLevelOuter[2] = 1.0;\n"
						  "   gl_TessLevelOuter[3] = 1.0;\n"
						  "}\n";

	std::string tc_string = tc_body;

	while ((token_location = tc_string.find(token_n_samples)) != std::string::npos)
	{
		tc_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = tc_string.find(token_sampler_declarations)) != std::string::npos)
	{
		tc_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = tc_string.find(token_sample_fetch)) != std::string::npos)
	{
		tc_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set tessellation evaluation shader's body */
	const char* te_body = "#version 400\n"
						  "\n"
						  "layout(quads) in;\n"
						  "\n"
						  "in  int  tc_te_vs_sampling_result[];\n"
						  "in  int  tc_te_tc_sampling_result[];\n"
						  "out int  te_gs_vs_sampling_result;\n"
						  "out int  te_gs_tc_sampling_result;\n"
						  "out int  te_gs_te_sampling_result;\n"
						  "out vec2 te_gs_uv;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    te_gs_vs_sampling_result = tc_te_vs_sampling_result[0];\n"
						  "    te_gs_tc_sampling_result = tc_te_tc_sampling_result[0];\n"
						  "    te_gs_te_sampling_result = 1;\n"
						  "\n"
						  /* gl_TessCoord spans from 0 to 1 for XY. To generate a screen-space quad,
		 * we need to project these components to <-1, 1>. */
						  "    gl_Position.xy = gl_TessCoord.xy * 2.0 - 1.0;\n"
						  "    gl_Position.zw = vec2(0, 1);\n"
						  "    te_gs_uv       = vec2(gl_TessCoord.x, 1.0 - gl_TessCoord.y);\n"
						  "\n"
						  "\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            te_gs_te_sampling_result = 0;\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "}\n";

	std::string te_string = te_body;

	while ((token_location = te_string.find(token_n_samples)) != std::string::npos)
	{
		te_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = te_string.find(token_sampler_declarations)) != std::string::npos)
	{
		te_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = te_string.find(token_sample_fetch)) != std::string::npos)
	{
		te_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set geometry shader's body */
	const char* gs_body = "#version 400\n"
						  "\n"
						  "layout (triangles)                        in;\n"
						  "layout (triangle_strip, max_vertices = 3) out;\n"
						  "\n"
						  "in  int  te_gs_vs_sampling_result[];\n"
						  "in  int  te_gs_tc_sampling_result[];\n"
						  "in  int  te_gs_te_sampling_result[];\n"
						  "in  vec2 te_gs_uv                [];\n"
						  "out int  gs_fs_vs_sampling_result;\n"
						  "out int  gs_fs_tc_sampling_result;\n"
						  "out int  gs_fs_te_sampling_result;\n"
						  "out int  gs_fs_gs_sampling_result;\n"
						  "out vec2 gs_fs_uv;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon            = 1.0 / 255.0;\n"
						  "    int         gs_sampling_result = 1;\n"
						  "    int         tc_sampling_result = te_gs_tc_sampling_result[0] & "
						  "te_gs_tc_sampling_result[1] & te_gs_tc_sampling_result[2];\n"
						  "    int         te_sampling_result = te_gs_te_sampling_result[0] & "
						  "te_gs_te_sampling_result[1] & te_gs_te_sampling_result[2];\n"
						  "    int         vs_sampling_result = te_gs_vs_sampling_result[0] & "
						  "te_gs_vs_sampling_result[1] & te_gs_vs_sampling_result[2];\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH;\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            gs_sampling_result = 0;\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "    gl_Position              = gl_in[0].gl_Position;\n"
						  "    gs_fs_uv                 = te_gs_uv[0];\n"
						  "    gs_fs_gs_sampling_result = gs_sampling_result;\n"
						  "    gs_fs_tc_sampling_result = tc_sampling_result;\n"
						  "    gs_fs_te_sampling_result = te_sampling_result;\n"
						  "    gs_fs_vs_sampling_result = vs_sampling_result;\n"
						  "    EmitVertex();\n"
						  "\n"
						  "    gl_Position              = gl_in[1].gl_Position;\n"
						  "    gs_fs_uv                 = te_gs_uv[1];\n"
						  "    gs_fs_gs_sampling_result = gs_sampling_result;\n"
						  "    gs_fs_tc_sampling_result = tc_sampling_result;\n"
						  "    gs_fs_te_sampling_result = te_sampling_result;\n"
						  "    gs_fs_vs_sampling_result = vs_sampling_result;\n"
						  "    EmitVertex();\n"
						  "\n"
						  "    gl_Position              = gl_in[2].gl_Position;\n"
						  "    gs_fs_uv                 = te_gs_uv[2];\n"
						  "    gs_fs_gs_sampling_result = gs_sampling_result;\n"
						  "    gs_fs_tc_sampling_result = tc_sampling_result;\n"
						  "    gs_fs_te_sampling_result = te_sampling_result;\n"
						  "    gs_fs_vs_sampling_result = vs_sampling_result;\n"
						  "    EmitVertex();\n"
						  "    EndPrimitive();\n"
						  "}\n";

	std::string gs_string = gs_body;

	while ((token_location = gs_string.find(token_n_samples)) != std::string::npos)
	{
		gs_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = gs_string.find(token_sampler_declarations)) != std::string::npos)
	{
		gs_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = gs_string.find(token_sample_fetch)) != std::string::npos)
	{
		gs_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set fragment shader's body */
	const char* fs_body = "#version 400\n"
						  "\n"
						  "in vec2 gs_fs_uv;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    result = vec4(1.0);\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            result = vec4(0.0);\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "}\n";

	std::string fs_string = fs_body;

	while ((token_location = fs_string.find(token_n_samples)) != std::string::npos)
	{
		fs_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = fs_string.find(token_sampler_declarations)) != std::string::npos)
	{
		fs_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = fs_string.find(token_sample_fetch)) != std::string::npos)
	{
		fs_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_fs_string);
	}

	/* Configure shader bodies */
	const char* fs_body_raw_ptr = fs_string.c_str();
	const char* gs_body_raw_ptr = gs_string.c_str();
	const char* tc_body_raw_ptr = tc_string.c_str();
	const char* te_body_raw_ptr = te_string.c_str();
	const char* vs_body_raw_ptr = vs_string.c_str();

	gl.shaderSource(m_fs_id, 1 /* count */, &fs_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_gs_id, 1 /* count */, &gs_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_tc_id, 1 /* count */, &tc_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_te_id, 1 /* count */, &te_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body_raw_ptr, NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call(s) failed.");

	/* Compile the shaders */
	const glw::GLuint  so_ids[] = { m_fs_id, m_gs_id, m_tc_id, m_te_id, m_vs_id };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	const glw::GLchar* shader_sources[] = { fs_body_raw_ptr, gs_body_raw_ptr, tc_body_raw_ptr, te_body_raw_ptr,
											vs_body_raw_ptr };

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		glw::GLint compile_status = GL_FALSE;
		glw::GLint so_id		  = so_ids[n_so_id];

		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status != GL_TRUE)
		{
			char temp[1024];

			gl.getShaderInfoLog(so_id, 1024, NULL, temp);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation error log:\n"
												<< temp << "\nShader source:\n"
												<< shader_sources[n_so_id] << tcu::TestLog::EndMessage;

			TCU_FAIL("Shader compilation failed");
		}

		/* Attach the shaders to the program object */
		gl.attachShader(m_po_id, so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed");
	} /* for (all shader objects) */

	/* Set up XFB */
	const char* varying_names[] = { "gs_fs_vs_sampling_result", "gs_fs_tc_sampling_result", "gs_fs_te_sampling_result",
									"gs_fs_gs_sampling_result" };
	const unsigned int n_varying_names = sizeof(varying_names) / sizeof(varying_names[0]);

	gl.transformFeedbackVaryings(m_po_id, n_varying_names, varying_names, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed.");
	}

	/* Retrieve uniform locations. Depending on the iteration, a number of those will be
	 * inactive.
	 */
	m_po_lod_location			   = gl.getUniformLocation(m_po_id, "lod");
	m_po_n_face_location		   = gl.getUniformLocation(m_po_id, "n_face");
	m_po_reference_colors_location = gl.getUniformLocation(m_po_id, "reference_colors");
	m_po_texture_location		   = gl.getUniformLocation(m_po_id, "texture");
	m_po_z_float_location		   = gl.getUniformLocation(m_po_id, "z_float");
	m_po_z_int_location			   = gl.getUniformLocation(m_po_id, "z_int");

	if (m_po_reference_colors_location == -1)
	{
		TCU_FAIL("reference_colors is considered an inactive uniform which is invalid.");
	}
}